

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dag.cpp
# Opt level: O1

void __thiscall DAGPropagator::~DAGPropagator(DAGPropagator *this)

{
  long lVar1;
  
  (this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator._vptr_Propagator =
       (_func_int **)&PTR__DAGPropagator_00211438;
  if (0 < (int)(this->super_DReachabilityPropagator).super_GraphPropagator.vs.sz) {
    lVar1 = 0;
    do {
      if (this->reachability[lVar1] != (Tint *)0x0) {
        operator_delete__(this->reachability[lVar1]);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < (int)(this->super_DReachabilityPropagator).super_GraphPropagator.vs.sz);
  }
  if (this->reachability != (Tint **)0x0) {
    operator_delete__(this->reachability);
  }
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->processed_n).super__Bvector_base<std::allocator<bool>_>);
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->processed_e).super__Bvector_base<std::allocator<bool>_>);
  std::vector<DAGPropagator::TrailedPredList,_std::allocator<DAGPropagator::TrailedPredList>_>::
  ~vector(&this->preds);
  std::vector<DAGPropagator::TrailedSuccList,_std::allocator<DAGPropagator::TrailedSuccList>_>::
  ~vector(&this->succs);
  DReachabilityPropagator::~DReachabilityPropagator(&this->super_DReachabilityPropagator);
  return;
}

Assistant:

DAGPropagator::~DAGPropagator() {
	for (int i = 0; i < nbNodes(); i++) {
		delete[] reachability[i];
	}
	delete[] reachability;
}